

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void lest::shuffle(tests *specification,options option)

{
  vector<lest::test,_std::allocator<lest::test>_> *this;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffec60;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffed10;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
  in_stack_ffffffffffffed18;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
  in_stack_ffffffffffffed20;
  
  this = (vector<lest::test,_std::allocator<lest::test>_> *)&stack0x00000008;
  std::vector<lest::test,_std::allocator<lest::test>_>::begin(this);
  std::vector<lest::test,_std::allocator<lest::test>_>::end(this);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(in_stack_ffffffffffffec60,(result_type)this);
  std::
  shuffle<__gnu_cxx::__normal_iterator<lest::test*,std::vector<lest::test,std::allocator<lest::test>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (in_stack_ffffffffffffed20,in_stack_ffffffffffffed18,in_stack_ffffffffffffed10);
  return;
}

Assistant:

inline void shuffle( tests & specification, options option )
{
#if lest_CPP11_OR_GREATER
    std::shuffle( specification.begin(), specification.end(), std::mt19937( option.seed ) );
#else
    lest::srand( option.seed );

    rng generator;
    std::random_shuffle( specification.begin(), specification.end(), generator );
#endif
}